

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void QApplication::setEffectEnabled(UIEffect effect,bool enable)

{
  uint uVar1;
  
  uVar1 = 0;
  if (effect < (UI_AnimateToolBox|UI_AnimateMenu)) {
    uVar1 = *(uint *)(&DAT_00660b50 + (ulong)effect * 4);
  }
  if (enable) {
    QApplicationPrivate::enabledAnimations =
         uVar1 >> 1 & 0x12 | uVar1 | QApplicationPrivate::enabledAnimations;
  }
  else {
    QApplicationPrivate::enabledAnimations = QApplicationPrivate::enabledAnimations & ~uVar1;
  }
  return;
}

Assistant:

void QApplication::setEffectEnabled(Qt::UIEffect effect, bool enable)
{
    int effectFlags = uiEffectToFlag(effect);
    if (enable) {
        if (effectFlags & QPlatformTheme::FadeMenuUiEffect)
            effectFlags |= QPlatformTheme::AnimateMenuUiEffect;
        if (effectFlags & QPlatformTheme::FadeTooltipUiEffect)
            effectFlags |= QPlatformTheme::AnimateTooltipUiEffect;
        QApplicationPrivate::enabledAnimations |= effectFlags;
    } else {
        QApplicationPrivate::enabledAnimations &= ~effectFlags;
    }
}